

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedEventLoop.cpp
# Opt level: O0

void __thiscall Storage::TimedEventLoop::run_for(TimedEventLoop *this,Cycles cycles)

{
  long lVar1;
  IntType IVar2;
  WrappedInt<Cycles> local_38;
  WrappedInt<Cycles> local_30;
  long local_28;
  IntType cycles_advanced;
  IntType remaining_cycles;
  TimedEventLoop *this_local;
  Cycles cycles_local;
  
  remaining_cycles = (IntType)this;
  this_local = (TimedEventLoop *)cycles.super_WrappedInt<Cycles>.length_;
  cycles_advanced = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  local_28 = 0;
  while (this->cycles_until_event_ <= cycles_advanced) {
    local_28 = this->cycles_until_event_ + local_28;
    Cycles::Cycles((Cycles *)&local_30,this->cycles_until_event_);
    (*this->_vptr_TimedEventLoop[1])(this,local_30.length_);
    cycles_advanced = cycles_advanced - this->cycles_until_event_;
    this->cycles_until_event_ = 0;
    (**this->_vptr_TimedEventLoop)();
  }
  if (cycles_advanced != 0) {
    this->cycles_until_event_ = this->cycles_until_event_ - cycles_advanced;
    local_28 = cycles_advanced + local_28;
    Cycles::Cycles((Cycles *)&local_38,cycles_advanced);
    (*this->_vptr_TimedEventLoop[1])(this,local_38.length_);
  }
  lVar1 = local_28;
  IVar2 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  if (lVar1 == IVar2) {
    if (0 < this->cycles_until_event_) {
      return;
    }
    __assert_fail("cycles_until_event_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/TimedEventLoop.cpp"
                  ,0x2d,"void Storage::TimedEventLoop::run_for(const Cycles)");
  }
  __assert_fail("cycles_advanced == cycles.as_integral()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/TimedEventLoop.cpp"
                ,0x2c,"void Storage::TimedEventLoop::run_for(const Cycles)");
}

Assistant:

void TimedEventLoop::run_for(const Cycles cycles) {
	auto remaining_cycles = cycles.as_integral();
#ifndef NDEBUG
	decltype(remaining_cycles) cycles_advanced = 0;
#endif

	while(cycles_until_event_ <= remaining_cycles) {
#ifndef NDEBUG
		cycles_advanced += cycles_until_event_;
#endif
		advance(cycles_until_event_);
		remaining_cycles -= cycles_until_event_;
		cycles_until_event_ = 0;
		process_next_event();
	}

	if(remaining_cycles) {
		cycles_until_event_ -= remaining_cycles;
#ifndef NDEBUG
		cycles_advanced += remaining_cycles;
#endif
		advance(remaining_cycles);
	}

	assert(cycles_advanced == cycles.as_integral());
	assert(cycles_until_event_ > 0);
}